

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_common.cc
# Opt level: O0

void PrintConnectionInfo(BIO *bio,SSL *ssl)

{
  SSL *pSVar1;
  uint16_t sigalg_00;
  int iVar2;
  char *pcVar3;
  X509 *pXVar4;
  X509_NAME *pXVar5;
  bool bVar6;
  unique_ptr<x509_st,_bssl::internal::Deleter> local_78;
  UniquePtr<X509> peer;
  size_t sct_list_len;
  uint8_t *sct_list;
  size_t ocsp_staple_len;
  uint8_t *ocsp_staple;
  char *host_name;
  uint8_t *puStack_40;
  uint alpn_len;
  uint8_t *alpn;
  uchar *puStack_30;
  uint next_proto_len;
  uint8_t *next_proto;
  uint16_t sigalg;
  SSL_CIPHER *pSStack_20;
  uint16_t group;
  SSL_CIPHER *cipher;
  SSL *ssl_local;
  BIO *bio_local;
  
  cipher = (SSL_CIPHER *)ssl;
  ssl_local = (SSL *)bio;
  pSStack_20 = SSL_get_current_cipher((SSL *)ssl);
  pSVar1 = ssl_local;
  pcVar3 = SSL_get_version((SSL *)cipher);
  BIO_printf((BIO *)pSVar1,"  Version: %s\n",pcVar3);
  pSVar1 = ssl_local;
  iVar2 = SSL_session_reused((SSL *)cipher);
  pcVar3 = "no";
  if (iVar2 != 0) {
    pcVar3 = "yes";
  }
  BIO_printf((BIO *)pSVar1,"  Resumed session: %s\n",pcVar3);
  pSVar1 = ssl_local;
  pcVar3 = SSL_CIPHER_standard_name((SSL_CIPHER *)pSStack_20);
  BIO_printf((BIO *)pSVar1,"  Cipher: %s\n",pcVar3);
  next_proto._6_2_ = SSL_get_group_id((SSL *)cipher);
  pSVar1 = ssl_local;
  if (next_proto._6_2_ != 0) {
    pcVar3 = SSL_get_group_name(next_proto._6_2_);
    BIO_printf((BIO *)pSVar1,"  ECDHE group: %s\n",pcVar3);
  }
  sigalg_00 = SSL_get_peer_signature_algorithm((SSL *)cipher);
  pSVar1 = ssl_local;
  next_proto._4_2_ = sigalg_00;
  if (sigalg_00 != 0) {
    iVar2 = SSL_version((SSL *)cipher);
    pcVar3 = SSL_get_signature_algorithm_name(sigalg_00,(uint)(iVar2 != 0x303));
    BIO_printf((BIO *)pSVar1,"  Signature algorithm: %s\n",pcVar3);
  }
  pSVar1 = ssl_local;
  iVar2 = SSL_get_secure_renegotiation_support((SSL *)cipher);
  pcVar3 = "no";
  if (iVar2 != 0) {
    pcVar3 = "yes";
  }
  BIO_printf((BIO *)pSVar1,"  Secure renegotiation: %s\n",pcVar3);
  pSVar1 = ssl_local;
  iVar2 = SSL_get_extms_support((SSL *)cipher);
  pcVar3 = "no";
  if (iVar2 != 0) {
    pcVar3 = "yes";
  }
  BIO_printf((BIO *)pSVar1,"  Extended master secret: %s\n",pcVar3);
  SSL_get0_next_proto_negotiated((SSL *)cipher,&stack0xffffffffffffffd0,(uint *)((long)&alpn + 4));
  BIO_printf((BIO *)ssl_local,"  Next protocol negotiated: %.*s\n",(ulong)alpn._4_4_,puStack_30);
  SSL_get0_alpn_selected((SSL *)cipher,&stack0xffffffffffffffc0,(uint *)((long)&host_name + 4));
  BIO_printf((BIO *)ssl_local,"  ALPN protocol: %.*s\n",(ulong)host_name._4_4_,puStack_40);
  ocsp_staple = (uint8_t *)SSL_get_servername((SSL *)cipher,0);
  if ((ocsp_staple != (uint8_t *)0x0) && (iVar2 = SSL_is_server((SSL *)cipher), iVar2 != 0)) {
    BIO_printf((BIO *)ssl_local,"  Client sent SNI: %s\n",ocsp_staple);
  }
  iVar2 = SSL_is_server((SSL *)cipher);
  if (iVar2 == 0) {
    SSL_get0_ocsp_response((SSL *)cipher,(uint8_t **)&ocsp_staple_len,(size_t *)&sct_list);
    pcVar3 = "no";
    if (sct_list != (uint8_t *)0x0) {
      pcVar3 = "yes";
    }
    BIO_printf((BIO *)ssl_local,"  OCSP staple: %s\n",pcVar3);
    SSL_get0_signed_cert_timestamp_list((SSL *)cipher,(uint8_t **)&sct_list_len,(size_t *)&peer);
    pcVar3 = "no";
    if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
        peer._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
      pcVar3 = "yes";
    }
    BIO_printf((BIO *)ssl_local,"  SCT list: %s\n",pcVar3);
  }
  pSVar1 = ssl_local;
  iVar2 = SSL_early_data_accepted((SSL *)cipher);
  bVar6 = true;
  if (iVar2 == 0) {
    iVar2 = SSL_in_early_data((SSL *)cipher);
    bVar6 = iVar2 != 0;
  }
  pcVar3 = "no";
  if (bVar6) {
    pcVar3 = "yes";
  }
  BIO_printf((BIO *)pSVar1,"  Early data: %s\n",pcVar3);
  pSVar1 = ssl_local;
  iVar2 = SSL_ech_accepted((SSL *)cipher);
  pcVar3 = "no";
  if (iVar2 != 0) {
    pcVar3 = "yes";
  }
  BIO_printf((BIO *)pSVar1,"  Encrypted ClientHello: %s\n",pcVar3);
  pXVar4 = SSL_get_peer_certificate((SSL *)cipher);
  std::unique_ptr<x509_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<x509_st,bssl::internal::Deleter> *)&local_78,(pointer)pXVar4);
  bVar6 = std::operator!=(&local_78,(nullptr_t)0x0);
  if (bVar6) {
    BIO_printf((BIO *)ssl_local,"  Cert subject: ");
    pSVar1 = ssl_local;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&local_78);
    pXVar5 = X509_get_subject_name(pXVar4);
    X509_NAME_print_ex((BIO *)pSVar1,pXVar5,0,0x82031f);
    BIO_printf((BIO *)ssl_local,"\n  Cert issuer: ");
    pSVar1 = ssl_local;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&local_78);
    pXVar5 = X509_get_issuer_name(pXVar4);
    X509_NAME_print_ex((BIO *)pSVar1,pXVar5,0,0x82031f);
    BIO_printf((BIO *)ssl_local,"\n");
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_78);
  return;
}

Assistant:

void PrintConnectionInfo(BIO *bio, const SSL *ssl) {
  const SSL_CIPHER *cipher = SSL_get_current_cipher(ssl);

  BIO_printf(bio, "  Version: %s\n", SSL_get_version(ssl));
  BIO_printf(bio, "  Resumed session: %s\n",
             SSL_session_reused(ssl) ? "yes" : "no");
  BIO_printf(bio, "  Cipher: %s\n", SSL_CIPHER_standard_name(cipher));
  uint16_t group = SSL_get_group_id(ssl);
  if (group != 0) {
    BIO_printf(bio, "  ECDHE group: %s\n", SSL_get_group_name(group));
  }
  uint16_t sigalg = SSL_get_peer_signature_algorithm(ssl);
  if (sigalg != 0) {
    BIO_printf(bio, "  Signature algorithm: %s\n",
               SSL_get_signature_algorithm_name(
                   sigalg, SSL_version(ssl) != TLS1_2_VERSION));
  }
  BIO_printf(bio, "  Secure renegotiation: %s\n",
             SSL_get_secure_renegotiation_support(ssl) ? "yes" : "no");
  BIO_printf(bio, "  Extended master secret: %s\n",
             SSL_get_extms_support(ssl) ? "yes" : "no");

  const uint8_t *next_proto;
  unsigned next_proto_len;
  SSL_get0_next_proto_negotiated(ssl, &next_proto, &next_proto_len);
  BIO_printf(bio, "  Next protocol negotiated: %.*s\n",
             static_cast<int>(next_proto_len), next_proto);

  const uint8_t *alpn;
  unsigned alpn_len;
  SSL_get0_alpn_selected(ssl, &alpn, &alpn_len);
  BIO_printf(bio, "  ALPN protocol: %.*s\n", static_cast<int>(alpn_len), alpn);

  const char *host_name = SSL_get_servername(ssl, TLSEXT_NAMETYPE_host_name);
  if (host_name != nullptr && SSL_is_server(ssl)) {
    BIO_printf(bio, "  Client sent SNI: %s\n", host_name);
  }

  if (!SSL_is_server(ssl)) {
    const uint8_t *ocsp_staple;
    size_t ocsp_staple_len;
    SSL_get0_ocsp_response(ssl, &ocsp_staple, &ocsp_staple_len);
    BIO_printf(bio, "  OCSP staple: %s\n", ocsp_staple_len > 0 ? "yes" : "no");

    const uint8_t *sct_list;
    size_t sct_list_len;
    SSL_get0_signed_cert_timestamp_list(ssl, &sct_list, &sct_list_len);
    BIO_printf(bio, "  SCT list: %s\n", sct_list_len > 0 ? "yes" : "no");
  }

  BIO_printf(
      bio, "  Early data: %s\n",
      (SSL_early_data_accepted(ssl) || SSL_in_early_data(ssl)) ? "yes" : "no");

  BIO_printf(bio, "  Encrypted ClientHello: %s\n",
             SSL_ech_accepted(ssl) ? "yes" : "no");

  // Print the server cert subject and issuer names.
  bssl::UniquePtr<X509> peer(SSL_get_peer_certificate(ssl));
  if (peer != nullptr) {
    BIO_printf(bio, "  Cert subject: ");
    X509_NAME_print_ex(bio, X509_get_subject_name(peer.get()), 0,
                       XN_FLAG_ONELINE);
    BIO_printf(bio, "\n  Cert issuer: ");
    X509_NAME_print_ex(bio, X509_get_issuer_name(peer.get()), 0,
                       XN_FLAG_ONELINE);
    BIO_printf(bio, "\n");
  }
}